

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::GetStateBlock
          (ChElementHexaANCF_3813_9 *this,ChVectorDynamic<> *mD)

{
  double *pdVar1;
  pointer psVar2;
  long lVar3;
  element_type *peVar4;
  element_type *peVar5;
  double *pdVar6;
  Index index_1;
  int i;
  long lVar7;
  double *pdVar8;
  Index index;
  ulong uVar9;
  ulong uVar10;
  
  psVar2 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar6 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar3 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  lVar7 = 0;
  pdVar8 = pdVar6;
  do {
    if (lVar3 + -3 < lVar7 * 3) goto LAB_006f73dc;
    pdVar1 = pdVar6 + lVar7 * 3;
    uVar9 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar9 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), 2 < uVar9)) {
      uVar9 = 3;
    }
    peVar4 = psVar2[lVar7].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (uVar9 != 0) {
      uVar10 = 0;
      do {
        pdVar8[uVar10] = *(double *)((long)&peVar4->super_ChNodeFEAbase + uVar10 * 8 + 0x20);
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    if (uVar9 < 3) {
      do {
        pdVar8[uVar9] = *(double *)((long)&peVar4->super_ChNodeFEAbase + uVar9 * 8 + 0x20);
        uVar9 = uVar9 + 1;
      } while (uVar9 != 3);
    }
    lVar7 = lVar7 + 1;
    pdVar8 = pdVar8 + 3;
  } while (lVar7 != 8);
  if (0x1a < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
  {
    pdVar6 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             0x18;
    uVar9 = 3;
    if ((((ulong)pdVar6 & 7) == 0) &&
       (uVar10 = (ulong)(-((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7), uVar10 < 3)) {
      uVar9 = uVar10;
    }
    peVar5 = (this->m_central_node).
             super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (uVar9 != 0) {
      uVar10 = 0;
      do {
        pdVar6[uVar10] = *(double *)((long)(&peVar5->m_ryy + -1) + uVar10 * 8);
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    if (uVar9 < 3) {
      do {
        pdVar6[uVar9] = *(double *)((long)(&peVar5->m_ryy + -1) + uVar9 * 8);
        uVar9 = uVar9 + 1;
      } while (uVar9 != 3);
    }
    if (0x1d < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
       ) {
      pdVar6 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 0x1b;
      uVar9 = 3;
      if ((((ulong)pdVar6 & 7) == 0) &&
         (uVar10 = (ulong)(-((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7), uVar10 < 3)) {
        uVar9 = uVar10;
      }
      peVar5 = (this->m_central_node).
               super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (uVar9 != 0) {
        uVar10 = 0;
        do {
          pdVar6[uVar10] = (peVar5->m_ryy).m_data[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      if (uVar9 < 3) {
        do {
          pdVar6[uVar9] = (peVar5->m_ryy).m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar9 != 3);
      }
      if (0x20 < (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows) {
        pdVar6 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + 0x1e;
        uVar9 = 3;
        if ((((ulong)pdVar6 & 7) == 0) &&
           (uVar10 = (ulong)(-((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7), uVar10 < 3)) {
          uVar9 = uVar10;
        }
        peVar5 = (this->m_central_node).
                 super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (uVar9 != 0) {
          uVar10 = 0;
          do {
            pdVar6[uVar10] = (peVar5->m_rzz).m_data[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        if (uVar9 < 3) {
          do {
            pdVar6[uVar9] = (peVar5->m_rzz).m_data[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar9 != 3);
        }
        return;
      }
    }
  }
LAB_006f73dc:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementHexaANCF_3813_9::GetStateBlock(ChVectorDynamic<>& mD) {
    for (int i = 0; i < 8; i++) {
        mD.segment(3 * i, 3) = m_nodes[i]->GetPos().eigen();
    }
    mD.segment(24, 3) = m_central_node->GetCurvatureXX().eigen();
    mD.segment(27, 3) = m_central_node->GetCurvatureYY().eigen();
    mD.segment(30, 3) = m_central_node->GetCurvatureZZ().eigen();
}